

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  byte bVar1;
  long *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  i64 *unaff_retaddr;
  char *in_stack_00000008;
  int n;
  int k;
  int i;
  u64 u;
  int local_30;
  int local_2c;
  int local_14;
  long local_10;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == '0') && ((in_RDI[1] == 'x' || (in_RDI[1] == 'X')))) {
    local_10 = 0;
    for (local_2c = 2; in_RDI[local_2c] == '0'; local_2c = local_2c + 1) {
    }
    local_30 = local_2c;
    while ((""[(byte)in_RDI[local_30]] & 8) != 0) {
      bVar1 = sqlite3HexToInt((int)in_RDI[local_30]);
      local_10 = local_10 * 0x10 + (ulong)bVar1;
      local_30 = local_30 + 1;
    }
    *in_RSI = local_10;
    if (local_30 - local_2c < 0x11) {
      if (in_RDI[local_30] == '\0') {
        local_14 = 0;
      }
      else {
        local_14 = 1;
      }
    }
    else {
      local_14 = 2;
    }
  }
  else {
    strspn(in_RDI,"+- \n\t0123456789");
    local_14 = sqlite3Atoi64(in_stack_00000008,unaff_retaddr,(int)((ulong)lVar2 >> 0x20),
                             (u8)((ulong)lVar2 >> 0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    if( k-i>16 ) return 2;
    if( z[k]!=0 ) return 1;
    return 0;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    int n = (int)(0x3fffffff&strspn(z,"+- \n\t0123456789"));
    if( z[n] ) n++;
    return sqlite3Atoi64(z, pOut, n, SQLITE_UTF8);
  }
}